

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

optional<long>
kratos::convert_value
          (Var *var,optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *values)

{
  ulong in_RAX;
  undefined8 in_RDX;
  optional<long> oVar1;
  optional<long> oVar2;
  
  if ((values->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged == true) {
    oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)in_RDX >> 8);
    oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value =
         (*(_Storage<long,_true> **)
           &(values->
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl)->_M_value;
    return (optional<long>)
           oVar1.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       0;
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)in_RAX;
  return (optional<long>)
         oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> convert_value(const Var *var,
                                     const std::optional<std::vector<uint64_t>> &values) {
    if (!values) {
        return std::nullopt;
    }
    auto const *v = &((*values)[0]);
    if (var->is_signed()) {
        auto const *s_v = reinterpret_cast<const int64_t *>(v);
        return *s_v;
    } else {
        return *v;
    }
}